

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Skeleton::setZAxis(Skeleton *this,Vector3D *axis)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = axis->z;
  dVar4 = axis->x;
  dVar5 = axis->y;
  dVar3 = 1.0 / SQRT(dVar1 * dVar1 + dVar4 * dVar4 + dVar5 * dVar5);
  dVar4 = dVar3 * dVar4;
  dVar5 = dVar3 * dVar5;
  auVar2._8_4_ = SUB84(dVar5,0);
  auVar2._0_8_ = dVar4;
  auVar2._12_4_ = (int)((ulong)dVar5 >> 0x20);
  axis->x = dVar4;
  axis->y = (double)auVar2._8_8_;
  axis->z = dVar1 * dVar3;
  dVar1 = acos(dVar4 * 0.0 + dVar5 * 0.0 + dVar1 * dVar3);
  if (1e-05 < ABS((float)dVar1)) {
    dVar4 = axis->z * 0.0;
    dVar5 = axis->y - dVar4;
    dVar4 = dVar4 - axis->x;
    dVar3 = axis->x * 0.0 + axis->y * -0.0;
    dVar6 = 1.0 / SQRT(dVar3 * dVar3 + dVar5 * dVar5 + dVar4 * dVar4);
    glRotatef(((float)dVar1 * -180.0) / 3.1415927,(float)(dVar5 * dVar6),
              CONCAT44((int)((ulong)(dVar4 * dVar6) >> 0x20),(float)(dVar4 * dVar6)),
              (float)(dVar6 * dVar3));
    return;
  }
  return;
}

Assistant:

void Skeleton::setZAxis(Vector3D axis)
  {
    Vector3D zAxis(0., 0., 1.);
    axis.normalize();
    float rot_angle = acos(dot(axis, zAxis));
    if (fabs(rot_angle) > 10E-6)
    {
      rot_angle = -rot_angle * 180 / M_PI;
      Vector3D rot_axis = cross(axis, zAxis);
      rot_axis.normalize();
      glRotatef(rot_angle, rot_axis.x, rot_axis.y, rot_axis.z);
    }
  }